

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::removeChild
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v)

{
  size_t __n;
  reference pvVar1;
  runtime_error *this_00;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  size_t rep;
  size_t in_stack_ffffffffffffffc8;
  
  __n = findRep(in_RDI,in_stack_ffffffffffffffc8);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&in_RDI->children_,__n);
  if (*pvVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Has no children to remove!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&in_RDI->children_,__n);
  *pvVar1 = *pvVar1 - 1;
  return;
}

Assistant:

inline void removeChild(size_t v)
    {
        auto rep = findRep(v);
        if (children_[rep] == 0) {
            throw std::runtime_error("Has no children to remove!");
        }
        --children_[rep];
    }